

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O1

void toml::detail::skip_key_value_pair<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar7 = loc->location_;
  lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar2;
  if (uVar7 < uVar4) {
    sVar5 = loc->line_number_;
    sVar6 = loc->column_number_;
    do {
      if (*(char *)(lVar2 + uVar7) == '=') {
        skip_whitespace<toml::type_config>(loc,ctx);
        skip_value<toml::type_config>(loc,ctx);
        return;
      }
      if ((uVar7 < uVar4) && (*(char *)(lVar2 + uVar7) == '\n')) {
        return;
      }
      if (uVar7 + 1 < uVar4) {
        if (*(char *)(lVar2 + uVar7) == '\n') {
          sVar5 = sVar5 + 1;
          loc->line_number_ = sVar5;
          sVar6 = 1;
        }
        else {
          sVar6 = sVar6 + 1;
        }
        loc->column_number_ = sVar6;
        uVar3 = uVar7 + 1;
      }
      else {
        for (; uVar3 = uVar4, uVar4 != uVar7; uVar7 = uVar7 + 1) {
          if (*(char *)(lVar2 + uVar7) == '\n') {
            sVar5 = sVar5 + 1;
            loc->line_number_ = sVar5;
            sVar6 = 1;
          }
          else {
            sVar6 = sVar6 + 1;
          }
          loc->column_number_ = sVar6;
        }
      }
      uVar7 = uVar3;
      loc->location_ = uVar7;
    } while (uVar7 < uVar4);
  }
  return;
}

Assistant:

void skip_key_value_pair(location& loc, const context<TC>& ctx)
{
    while( ! loc.eof())
    {
        if(loc.current() == '=')
        {
            skip_whitespace(loc, ctx);
            skip_value(loc, ctx);
            return;
        }
        else if(loc.current() == '\n')
        {
            // newline is found before finding `=`. assuming "missing `=`".
            return;
        }
        loc.advance();
    }
    return ;
}